

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O2

void Omega_h::fill_linear<signed_char>(Write<signed_char> *a,char offset,char stride)

{
  Alloc *pAVar1;
  LO n;
  type f;
  type tStack_38;
  
  Write<signed_char>::Write(&tStack_38.a,a);
  pAVar1 = (a->shared_alloc_).alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    n = (LO)pAVar1->size;
  }
  else {
    n = (LO)((ulong)pAVar1 >> 3);
  }
  tStack_38.offset = offset;
  tStack_38.stride = stride;
  parallel_for<Omega_h::fill_linear<signed_char>(Omega_h::Write<signed_char>,signed_char,signed_char)::_lambda(int)_1_>
            (n,&tStack_38,"Write(size,offset,stride)");
  Write<signed_char>::~Write(&tStack_38.a);
  return;
}

Assistant:

void fill_linear(Write<T> a, T offset, T stride) {
  auto f = OMEGA_H_LAMBDA(LO i) {
    a[i] = offset + (stride * static_cast<T>(i));
  };
  parallel_for(a.size(), f, "Write(size,offset,stride)");
}